

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

Vector<float,_2> __thiscall
deqp::gles31::Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
          (_anonymous_namespace_ *this,Vector<float,_2> (*values) [4],float xFactor,float yFactor)

{
  Vector<float,_2> VVar1;
  Vector<float,_2> *res_5;
  int i;
  long lVar2;
  float fVar3;
  Vector<float,_2> res_3;
  Vector<float,_2> res_4;
  Vector<float,_2> res;
  Vector<float,_2> res_1;
  Vector<float,_2> res_2;
  
  if (1.0 <= xFactor + yFactor) {
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res.m_data[lVar2] = (*values)[1].m_data[lVar2] - (*values)[3].m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_1.m_data[lVar2] = res.m_data[lVar2] * (1.0 - xFactor);
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_2.m_data[lVar2] = (*values)[3].m_data[lVar2] + res_1.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_3.m_data[lVar2] = (*values)[2].m_data[lVar2] - (*values)[3].m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    res_4.m_data[0] = 0.0;
    res_4.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_4.m_data[lVar2] = res_3.m_data[lVar2] * (1.0 - yFactor);
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    *(undefined8 *)this = 0;
    lVar2 = 0;
    do {
      fVar3 = res_2.m_data[lVar2] + res_4.m_data[lVar2];
      *(float *)(this + lVar2 * 4) = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
  }
  else {
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res.m_data[lVar2] = (*values)[2].m_data[lVar2] - (*values)[0].m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_1.m_data[lVar2] = res.m_data[lVar2] * xFactor;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_2.m_data[lVar2] = (*values)[0].m_data[lVar2] + res_1.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_3.m_data[lVar2] = (*values)[1].m_data[lVar2] - (*values)[0].m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    res_4.m_data[0] = 0.0;
    res_4.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_4.m_data[lVar2] = res_3.m_data[lVar2] * yFactor;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    *(undefined8 *)this = 0;
    lVar2 = 0;
    do {
      fVar3 = res_2.m_data[lVar2] + res_4.m_data[lVar2];
      *(float *)(this + lVar2 * 4) = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
  }
  VVar1.m_data[1] = 0.0;
  VVar1.m_data[0] = fVar3;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

static inline T triQuadInterpolate (const T (&values)[4], float xFactor, float yFactor)
{
	if (xFactor + yFactor < 1.0f)
		return values[0] + (values[2]-values[0])*xFactor		+ (values[1]-values[0])*yFactor;
	else
		return values[3] + (values[1]-values[3])*(1.0f-xFactor)	+ (values[2]-values[3])*(1.0f-yFactor);
}